

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O3

void __thiscall Assimp::D3DS::Mesh::~Mesh(Mesh *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer paVar3;
  pointer pcVar4;
  pointer pFVar5;
  
  puVar2 = (this->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->mFaceMaterials).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  paVar3 = (this->mTexCoords).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->mTexCoords).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
  }
  pcVar4 = (this->mName)._M_dataplus._M_p;
  paVar1 = &(this->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  paVar3 = (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mNormals.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mNormals.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
  }
  pFVar5 = (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
           super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pFVar5 != (pointer)0x0) {
    operator_delete(pFVar5,(long)(this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
                                 super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar5);
  }
  paVar3 = (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).
                                 mPositions.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
    return;
  }
  return;
}

Assistant:

Mesh() = delete;